

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall mocker::detail::InterferenceGraph::combine(InterferenceGraph *this,Node *v,Node *u)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *this_00;
  mapped_type *pmVar3;
  shared_ptr<mocker::nasm::Register> local_a8;
  shared_ptr<mocker::nasm::Register> local_98;
  reference local_88;
  shared_ptr<mocker::nasm::Register> *t;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range2;
  Node *u_local;
  Node *v_local;
  InterferenceGraph *this_local;
  
  bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                    (&this->freeze,v);
  if (bVar1) {
    iVar2 = std::
            unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::find(&this->freeze,v);
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::erase(&this->freeze,iVar2);
  }
  else {
    iVar2 = std::
            unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::find(&this->highDegree,v);
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::erase(&this->highDegree,iVar2);
  }
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
  ::emplace<std::shared_ptr<mocker::nasm::Register>const&>
            ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
              *)&this->coalesced,v);
  this_00 = std::
            unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
            ::at(&this->alias,v);
  std::shared_ptr<mocker::nasm::Register>::operator=(this_00,u);
  getCurAdjList((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)&__begin2,this,v);
  __end2 = std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&__begin2);
  t = (shared_ptr<mocker::nasm::Register> *)
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                *)&t);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_98,local_88);
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_a8,u);
    addEdge(this,&local_98,&local_a8);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_a8);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_98);
    pmVar3 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
             ::at(&this->curDegree,local_88);
    *pmVar3 = *pmVar3 - 1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)&__begin2);
  bVar1 = isPrecolored(u);
  if (!bVar1) {
    classifyNode(this,u);
  }
  return;
}

Assistant:

void InterferenceGraph::combine(const Node &v, const Node &u) {
  if (isIn(freeze, v))
    freeze.erase(freeze.find(v));
  else
    highDegree.erase(highDegree.find(v));
  coalesced.emplace(v);
  alias.at(v) = u;
  // The associated moves are handle externally

  for (auto &t : getCurAdjList(v)) {
    // Note that we do not remove node v explicitly. Hence, we have to
    // decrement the degree of t manually.
    addEdge(t, u);
    curDegree.at(t)--;

    // Do not use decrementDegree here since it may trigger some unnecessary
    // task if the original degree of t is K
    //    if (!isPrecolored(t))
    //      classifyNode(t);
    //    decrementDegree(t);
  }
  if (!isPrecolored(u))
    classifyNode(u);
}